

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::operator&&(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ExprPtr EVar6;
  initializer_list<std::shared_ptr<const_mathiu::impl::Expr>_> __l;
  allocator_type local_79;
  vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_78;
  shared_ptr<const_mathiu::impl::Expr> local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Variadic_union<mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not> local_40;
  undefined1 local_28;
  
  bVar2 = equal(lhs,rhs);
  if (bVar2) {
    *(element_type **)this =
         (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
    _Var4._M_pi = extraout_RDX;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  else {
    local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_50 = (rhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    local_48 = (rhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
    __l._M_len = 2;
    __l._M_array = &local_60;
    std::
    vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::vector(&local_78,__l,&local_79);
    local_40._0_8_ =
         local_78.
         super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_40._8_8_ =
         local_78.
         super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_40._16_8_ =
         local_78.
         super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.
    super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28 = 0;
    puVar3 = (undefined8 *)operator_new(0x50);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_00253718;
    std::__detail::__variant::
    _Move_ctor_base<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not>::_Move_ctor_base
              ((_Move_ctor_base<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not> *)
               (puVar3 + 2),
               (_Move_ctor_base<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not> *)
               &local_40._M_first);
    *(undefined1 *)(puVar3 + 9) = 0x15;
    std::__detail::__variant::
    _Variant_storage<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not>::
    ~_Variant_storage((_Variant_storage<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not>
                       *)&local_40._M_first);
    std::
    vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::~vector(&local_78);
    lVar5 = 0x20;
    _Var4._M_pi = extraout_RDX_00;
    do {
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&local_78.
                        super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5);
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        _Var4._M_pi = extraout_RDX_01;
      }
      lVar5 = lVar5 + -0x10;
    } while (lVar5 != 0);
    *(_Move_ctor_base<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not> **)this =
         (_Move_ctor_base<false,_mathiu::impl::And,_mathiu::impl::Or,_mathiu::impl::Not> *)
         (puVar3 + 2);
    *(undefined8 **)(this + 8) = puVar3;
  }
  EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator&&(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return lhs;
        }
        return match(lhs, rhs)(
            pattern | _ = [&]
            { return makeSharedExprPtr(Logical{And{{{lhs, rhs}}}}); });
    }